

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

void duckdb::UncompressedStringInitPrefetch(ColumnSegment *segment,PrefetchState *prefetch_state)

{
  size_t sVar1;
  BlockManager *manager_p;
  BlockManager *block_id;
  size_t sVar2;
  optional_ptr<duckdb::CompressedSegmentState,_true> segment_state;
  shared_ptr<duckdb::BlockHandle,_true> block_handle;
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> local_68;
  __shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_50 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  ::std::__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x10),
             (__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)&segment->block);
  PrefetchState::AddBlock(prefetch_state,(shared_ptr<duckdb::BlockHandle,_true> *)(local_50 + 0x10))
  ;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  local_68._M_head_impl =
       (segment->segment_state).
       super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
       .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  if (local_68._M_head_impl != (CompressedSegmentState *)0x0) {
    manager_p = (BlockManager *)
                optional_ptr<duckdb::CompressedSegmentState,_true>::operator->
                          ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_68);
    block_id = ColumnSegment::GetBlockManager(segment);
    sVar1 = (manager_p->blocks)._M_h._M_rehash_policy._M_next_resize;
    for (sVar2 = *(size_t *)&(manager_p->blocks)._M_h._M_rehash_policy; sVar2 != sVar1;
        sVar2 = sVar2 + 8) {
      UncompressedStringSegmentState::GetHandle
                ((UncompressedStringSegmentState *)local_50,manager_p,(block_id_t)block_id);
      ::std::__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,(__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)local_50
                );
      PrefetchState::AddBlock(prefetch_state,(shared_ptr<duckdb::BlockHandle,_true> *)&local_60);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    }
  }
  return;
}

Assistant:

void UncompressedStringInitPrefetch(ColumnSegment &segment, PrefetchState &prefetch_state) {
	prefetch_state.AddBlock(segment.block);
	auto segment_state = segment.GetSegmentState();
	if (segment_state) {
		auto &state = segment_state->Cast<UncompressedStringSegmentState>();
		auto &block_manager = segment.GetBlockManager();
		for (auto &block_id : state.on_disk_blocks) {
			auto block_handle = state.GetHandle(block_manager, block_id);
			prefetch_state.AddBlock(block_handle);
		}
	}
}